

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  Layer *pLVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar18;
  int iVar19;
  int iVar20;
  _func_int **pp_Var21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  int remain_1;
  long lVar26;
  float *pfVar27;
  _func_int *p_Var28;
  long lVar29;
  _Vector_base<float,_std::allocator<float>_> *this_00;
  int remain_2;
  void *pvVar30;
  long lVar31;
  ulong uVar32;
  int g;
  long lVar33;
  void *pvVar34;
  long lVar35;
  long lVar36;
  int remain;
  int iVar37;
  float fVar38;
  float fVar39;
  void *local_250;
  undefined1 *local_248;
  int local_240;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_bordered;
  vector<float,_std::allocator<float>_> requantize_scales;
  Mat bottom_blob_g;
  _Vector_base<float,_std::allocator<float>_> local_d0;
  _Vector_base<float,_std::allocator<float>_> local_b8;
  _Vector_base<float,_std::allocator<float>_> local_a0;
  _Vector_base<float,_std::allocator<float>_> local_88;
  Mat bottom_blob_unbordered;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined3 uVar14;
  undefined1 uVar15;
  undefined2 uVar16;
  undefined1 uVar17;
  
  iVar20 = bottom_blob->w;
  iVar25 = bottom_blob->h;
  iVar19 = bottom_blob->c;
  sVar5 = bottom_blob->elemsize;
  p_Var28 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar37 = *(int *)(&this->field_0xbc + (long)p_Var28);
  iVar18 = *(int *)(&this->field_0xc4 + (long)p_Var28);
  iVar3 = *(int *)(&this->field_0xc0 + (long)p_Var28);
  iVar4 = *(int *)(&this->field_0xc8 + (long)p_Var28);
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if (sVar5 == 1) {
    pp_Var21 = this->_vptr_ConvolutionDepthWise_x86;
  }
  else {
    Mat::create(&bottom_blob_unbordered,iVar20,iVar25,iVar19,1,opt->workspace_allocator);
    local_240 = -100;
    if ((bottom_blob_unbordered.data == (void *)0x0) ||
       ((long)bottom_blob_unbordered.c * bottom_blob_unbordered.cstep == 0)) goto LAB_0014ad63;
    pp_Var21 = this->_vptr_ConvolutionDepthWise_x86;
    p_Var28 = pp_Var21[-3];
    iVar25 = iVar19 / *(int *)(&this->field_0xf0 + (long)p_Var28);
    iVar20 = 0;
    for (lVar33 = 0; lVar33 < *(int *)(&this->field_0xf0 + (long)p_Var28); lVar33 = lVar33 + 1) {
      uVar10._0_1_ = opt->lightmode;
      uVar10._1_3_ = *(undefined3 *)&opt->field_0x1;
      uVar10._4_4_ = opt->num_threads;
      uVar11._0_1_ = opt->use_winograd_convolution;
      uVar11._1_1_ = opt->use_sgemm_convolution;
      uVar11._2_1_ = opt->use_int8_inference;
      uVar11._3_1_ = opt->use_vulkan_compute;
      uVar12 = opt->use_fp16_packed;
      uVar13 = opt->use_fp16_storage;
      uVar15 = opt->use_fp16_arithmetic;
      uVar17 = opt->use_int8_storage;
      uVar16 = CONCAT11(uVar17,uVar15);
      uVar14 = CONCAT21(uVar16,uVar13);
      uVar11._4_4_ = CONCAT31(uVar14,uVar12);
      bottom_blob_bordered.allocator = *(Allocator **)&opt->use_int8_arithmetic;
      bottom_blob_bordered.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      bottom_blob_bordered.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      bottom_blob_bordered.elempack = (int)uVar11;
      bottom_blob_bordered.data = (void *)CONCAT44(1,(int)uVar10);
      bottom_blob_bordered.refcount._0_4_ = SUB84(bottom_blob_unbordered.allocator,0);
      bottom_blob_bordered.refcount._4_4_ =
           (undefined4)((ulong)bottom_blob_unbordered.allocator >> 0x20);
      bottom_blob_bordered._28_4_ = uVar11._4_4_;
      Mat::channel_range(&bottom_blob_g,bottom_blob,iVar20,iVar25);
      Mat::channel_range(&bottom_blob_int8_g,&bottom_blob_unbordered,iVar20,iVar25);
      quantize_float32_to_int8
                (&bottom_blob_g,&bottom_blob_int8_g,
                 *(float *)(*(long *)(&this->field_0x200 +
                                     (long)this->_vptr_ConvolutionDepthWise_x86[-3]) + lVar33 * 4),
                 (Option *)&bottom_blob_bordered);
      Mat::~Mat(&bottom_blob_int8_g);
      Mat::~Mat(&bottom_blob_g);
      pp_Var21 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var28 = pp_Var21[-3];
      iVar20 = iVar20 + iVar25;
    }
  }
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered.elemsize._4_4_ = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.c = 0;
  bottom_blob_bordered.cstep = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var21[-3]),
             &bottom_blob_unbordered,&bottom_blob_bordered,opt);
  local_240 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    p_Var28 = this->_vptr_ConvolutionDepthWise_x86[-3];
    Mat::create(top_blob,(~((iVar37 + -1) * iVar18) + bottom_blob_bordered.w) /
                         *(int *)(&this->field_0xcc + (long)p_Var28) + 1,
                (~((iVar3 + -1) * iVar4) + bottom_blob_bordered.h) /
                *(int *)(&this->field_0xd0 + (long)p_Var28) + 1,
                *(int *)(&this->field_0xb8 + (long)p_Var28),
                ((ulong)(byte)(&this->field_0x244)[(long)p_Var28] ^ 1) * 3 + 1,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      pp_Var21 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var28 = pp_Var21[-3];
      if ((iVar19 == *(int *)(&this->field_0xf0 + (long)p_Var28)) &&
         (iVar19 == *(int *)(&this->field_0xb8 + (long)p_Var28))) {
        if ((&this->field_0x244)[(long)p_Var28] == '\x01') {
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (lVar33 = 0; p_Var28 = pp_Var21[-3],
              lVar33 < *(int *)(&this->field_0xf0 + (long)p_Var28); lVar33 = lVar33 + 1) {
            fVar38 = *(float *)(*(long *)(&this->field_0x1c0 + (long)p_Var28) + lVar33 * 4);
            bottom_blob_g.data._0_4_ = 0.0;
            if (fVar38 != 0.0) {
              bottom_blob_g.data._0_4_ =
                   1.0 / (fVar38 * *(float *)(*(long *)(&this->field_0x200 + (long)p_Var28) +
                                             lVar33 * 4));
            }
            bottom_blob_int8_g.data =
                 (void *)CONCAT44(bottom_blob_int8_g.data._4_4_,
                                  *(undefined4 *)(&this->field_0x240 + (long)p_Var28));
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict4 *)&bottom_blob_g);
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict4 *)&bottom_blob_int8_g);
            pp_Var21 = this->_vptr_ConvolutionDepthWise_x86;
          }
          if ((*(int *)(&this->field_0xbc + (long)p_Var28) != 3) ||
             (*(int *)(&this->field_0xc0 + (long)p_Var28) != 3)) {
LAB_0014abaa:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
            goto LAB_0014abbb;
          }
          if ((*(int *)(&this->field_0xc4 + (long)p_Var28) == 1) &&
             (((*(int *)(&this->field_0xc8 + (long)p_Var28) == 1 &&
               (*(int *)(&this->field_0xcc + (long)p_Var28) == 1)) &&
              (*(int *)(&this->field_0xd0 + (long)p_Var28) == 1)))) {
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_88,&requantize_scales);
            lVar23 = (long)bottom_blob_bordered.w;
            iVar20 = top_blob->w;
            iVar25 = top_blob->h;
            lVar33 = *(long *)(&this->field_0x140 + (long)p_Var28);
            lVar6 = *(long *)(&this->field_0x180 + (long)p_Var28);
            uVar32 = 0;
            if (iVar25 < 1) {
              iVar25 = 0;
            }
            uVar22 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar22 = uVar32;
            }
            for (; uVar32 != uVar22; uVar32 = uVar32 + 1) {
              Mat::channel(&bottom_blob_g,top_blob,(int)uVar32);
              if (lVar6 == 0) {
                fVar38 = 0.0;
              }
              else {
                fVar38 = *(float *)(lVar6 + uVar32 * 4);
              }
              local_250 = (void *)CONCAT44(bottom_blob_g.data._4_4_,bottom_blob_g.data._0_4_);
              fVar1 = local_88._M_impl.super__Vector_impl_data._M_start[uVar32 * 2];
              fVar2 = local_88._M_impl.super__Vector_impl_data._M_start[uVar32 * 2 + 1];
              lVar35 = uVar32 * 9;
              bottom_blob_int8_g.elemsize =
                   CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                            (undefined4)bottom_blob_bordered.elemsize);
              local_248 = (undefined1 *)
                          ((long)(int)uVar32 * bottom_blob_bordered.cstep *
                           bottom_blob_int8_g.elemsize + (long)bottom_blob_bordered.data);
              bottom_blob_int8_g.refcount = (int *)0x0;
              bottom_blob_int8_g.elempack = bottom_blob_bordered.elempack;
              bottom_blob_int8_g.allocator = bottom_blob_bordered.allocator;
              bottom_blob_int8_g.dims = 2;
              bottom_blob_int8_g.w = bottom_blob_bordered.w;
              bottom_blob_int8_g.h = bottom_blob_bordered.h;
              bottom_blob_int8_g.c = 1;
              bottom_blob_int8_g.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
              bottom_blob_int8_g.data = local_248;
              Mat::~Mat(&bottom_blob_int8_g);
              lVar26 = (long)local_248 + lVar23;
              pvVar34 = (void *)((long)local_248 + lVar23 * 2);
              for (iVar19 = 0; iVar19 != iVar25; iVar19 = iVar19 + 1) {
                lVar31 = 0;
                for (iVar37 = iVar20; 0 < iVar37; iVar37 = iVar37 + -1) {
                  fVar39 = roundf(((float)((int)*(char *)(lVar33 + 8 + lVar35) *
                                           (int)*(char *)((long)pvVar34 + lVar31 + 2) +
                                           (int)*(char *)(lVar33 + 7 + lVar35) *
                                           (int)*(char *)((long)pvVar34 + lVar31 + 1) +
                                          (int)*(char *)(lVar33 + 6 + lVar35) *
                                          (int)*(char *)((long)pvVar34 + lVar31) +
                                          (int)*(char *)(lVar33 + 5 + lVar35) *
                                          (int)*(char *)(lVar26 + 2 + lVar31) +
                                          (int)*(char *)(lVar33 + 4 + lVar35) *
                                          (int)*(char *)(lVar26 + 1 + lVar31) +
                                          (int)*(char *)(lVar33 + 3 + lVar35) *
                                          (int)*(char *)(lVar26 + lVar31) +
                                          (int)*(char *)(lVar33 + 2 + lVar35) *
                                          (int)*(char *)((long)local_248 + lVar31 + 2) +
                                          (int)*(char *)(lVar33 + 1 + lVar35) *
                                          (int)*(char *)((long)local_248 + lVar31 + 1) +
                                          (int)*(char *)(lVar33 + lVar35) *
                                          (int)*(char *)((long)local_248 + lVar31)) * fVar1 + fVar38
                                  ) * fVar2);
                  iVar18 = (int)fVar39;
                  if (iVar18 < -0x7e) {
                    iVar18 = -0x7f;
                  }
                  if (0x7e < iVar18) {
                    iVar18 = 0x7f;
                  }
                  *(char *)((long)local_250 + lVar31) = (char)iVar18;
                  lVar31 = lVar31 + 1;
                }
                local_248 = (undefined1 *)((long)local_248 + lVar31 + 2);
                lVar26 = lVar26 + lVar31 + 2;
                pvVar34 = (void *)((long)pvVar34 + lVar31 + 2);
                local_250 = (void *)((long)local_250 + lVar31);
              }
              Mat::~Mat(&bottom_blob_g);
            }
            this_00 = &local_88;
          }
          else {
            if (((*(int *)(&this->field_0xc4 + (long)p_Var28) != 1) ||
                (*(int *)(&this->field_0xc8 + (long)p_Var28) != 1)) ||
               ((*(int *)(&this->field_0xcc + (long)p_Var28) != 2 ||
                (*(int *)(&this->field_0xd0 + (long)p_Var28) != 2)))) goto LAB_0014abaa;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_a0,&requantize_scales);
            lVar23 = (long)bottom_blob_bordered.w;
            iVar20 = top_blob->w;
            iVar25 = top_blob->h;
            lVar33 = *(long *)(&this->field_0x140 + (long)p_Var28);
            lVar6 = *(long *)(&this->field_0x180 + (long)p_Var28);
            uVar32 = 0;
            if (iVar25 < 1) {
              iVar25 = 0;
            }
            lVar26 = (long)((bottom_blob_bordered.w - iVar20) * 2);
            uVar22 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar22 = uVar32;
            }
            for (; uVar32 != uVar22; uVar32 = uVar32 + 1) {
              Mat::channel(&bottom_blob_g,top_blob,(int)uVar32);
              if (lVar6 == 0) {
                fVar38 = 0.0;
              }
              else {
                fVar38 = *(float *)(lVar6 + uVar32 * 4);
              }
              local_248 = (undefined1 *)CONCAT44(bottom_blob_g.data._4_4_,bottom_blob_g.data._0_4_);
              fVar1 = local_a0._M_impl.super__Vector_impl_data._M_start[uVar32 * 2];
              fVar2 = local_a0._M_impl.super__Vector_impl_data._M_start[uVar32 * 2 + 1];
              lVar31 = uVar32 * 9;
              bottom_blob_int8_g.elemsize =
                   CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                            (undefined4)bottom_blob_bordered.elemsize);
              local_250 = (void *)((long)(int)uVar32 * bottom_blob_bordered.cstep *
                                   bottom_blob_int8_g.elemsize + (long)bottom_blob_bordered.data);
              bottom_blob_int8_g.refcount = (int *)0x0;
              bottom_blob_int8_g.elempack = bottom_blob_bordered.elempack;
              bottom_blob_int8_g.allocator = bottom_blob_bordered.allocator;
              bottom_blob_int8_g.dims = 2;
              bottom_blob_int8_g.w = bottom_blob_bordered.w;
              bottom_blob_int8_g.h = bottom_blob_bordered.h;
              bottom_blob_int8_g.c = 1;
              bottom_blob_int8_g.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
              bottom_blob_int8_g.data = local_250;
              Mat::~Mat(&bottom_blob_int8_g);
              lVar35 = (long)local_250 + lVar23;
              pvVar34 = (void *)((long)local_250 + lVar23 * 2);
              for (iVar19 = 0; iVar19 != iVar25; iVar19 = iVar19 + 1) {
                lVar36 = 0;
                for (iVar37 = iVar20; 0 < iVar37; iVar37 = iVar37 + -1) {
                  fVar39 = roundf(((float)((int)*(char *)(lVar33 + 8 + lVar31) *
                                           (int)*(char *)((long)pvVar34 + lVar36 + 2) +
                                           (int)*(char *)(lVar33 + 7 + lVar31) *
                                           (int)*(char *)((long)pvVar34 + lVar36 + 1) +
                                          (int)*(char *)(lVar33 + 6 + lVar31) *
                                          (int)*(char *)((long)pvVar34 + lVar36) +
                                          (int)*(char *)(lVar33 + 5 + lVar31) *
                                          (int)*(char *)(lVar35 + 2 + lVar36) +
                                          (int)*(char *)(lVar33 + 4 + lVar31) *
                                          (int)*(char *)(lVar35 + 1 + lVar36) +
                                          (int)*(char *)(lVar33 + 3 + lVar31) *
                                          (int)*(char *)(lVar35 + lVar36) +
                                          (int)*(char *)(lVar33 + 2 + lVar31) *
                                          (int)*(char *)((long)local_250 + lVar36 + 2) +
                                          (int)*(char *)(lVar33 + 1 + lVar31) *
                                          (int)*(char *)((long)local_250 + lVar36 + 1) +
                                          (int)*(char *)(lVar33 + lVar31) *
                                          (int)*(char *)((long)local_250 + lVar36)) * fVar1 + fVar38
                                  ) * fVar2);
                  iVar18 = (int)fVar39;
                  if (iVar18 < -0x7e) {
                    iVar18 = -0x7f;
                  }
                  if (0x7e < iVar18) {
                    iVar18 = 0x7f;
                  }
                  *local_248 = (char)iVar18;
                  local_248 = local_248 + 1;
                  lVar36 = lVar36 + 2;
                }
                local_250 = (void *)((long)local_250 + lVar36 + lVar26);
                lVar35 = lVar35 + lVar26 + lVar36;
                pvVar34 = (void *)((long)pvVar34 + lVar36 + lVar26);
              }
              Mat::~Mat(&bottom_blob_g);
            }
            this_00 = &local_a0;
          }
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_00);
          pLVar7 = this->activation;
          if (pLVar7 != (Layer *)0x0) {
            (*pLVar7->_vptr_Layer[9])(pLVar7,top_blob,opt);
          }
        }
        else {
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          for (lVar33 = 0; p_Var28 = pp_Var21[-3],
              lVar33 < *(int *)(&this->field_0xf0 + (long)p_Var28); lVar33 = lVar33 + 1) {
            bottom_blob_g.data._0_4_ =
                 1.0 / (*(float *)(*(long *)(&this->field_0x1c0 + (long)p_Var28) + lVar33 * 4) *
                       *(float *)(*(long *)(&this->field_0x200 + (long)p_Var28) + lVar33 * 4));
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict4 *)&bottom_blob_g);
            pp_Var21 = this->_vptr_ConvolutionDepthWise_x86;
          }
          if ((*(int *)(&this->field_0xbc + (long)p_Var28) != 3) ||
             (*(int *)(&this->field_0xc0 + (long)p_Var28) != 3)) goto LAB_0014abaa;
          if ((*(int *)(&this->field_0xcc + (long)p_Var28) == 1) &&
             (((*(int *)(&this->field_0xd0 + (long)p_Var28) == 1 &&
               (*(int *)(&this->field_0xc4 + (long)p_Var28) == 1)) &&
              (*(int *)(&this->field_0xc8 + (long)p_Var28) == 1)))) {
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_b8,&requantize_scales);
            lVar23 = (long)bottom_blob_bordered.w;
            iVar20 = top_blob->w;
            lVar33 = *(long *)(&this->field_0x140 + (long)p_Var28);
            lVar6 = *(long *)(&this->field_0x180 + (long)p_Var28);
            uVar32 = 0;
            iVar25 = top_blob->h;
            if (top_blob->h < 1) {
              iVar25 = 0;
            }
            uVar22 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar22 = uVar32;
            }
            for (; uVar32 != uVar22; uVar32 = uVar32 + 1) {
              Mat::channel(&bottom_blob_g,top_blob,(int)uVar32);
              if (lVar6 == 0) {
                fVar38 = 0.0;
              }
              else {
                fVar38 = *(float *)(lVar6 + uVar32 * 4);
              }
              lVar35 = CONCAT44(bottom_blob_g.data._4_4_,bottom_blob_g.data._0_4_);
              fVar1 = local_b8._M_impl.super__Vector_impl_data._M_start[uVar32];
              Mat::fill(&bottom_blob_g,fVar38);
              lVar26 = uVar32 * 9;
              bottom_blob_int8_g.elemsize =
                   CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                            (undefined4)bottom_blob_bordered.elemsize);
              pvVar30 = (void *)((long)(int)uVar32 * bottom_blob_bordered.cstep *
                                 bottom_blob_int8_g.elemsize + (long)bottom_blob_bordered.data);
              bottom_blob_int8_g.refcount = (int *)0x0;
              bottom_blob_int8_g.elempack = bottom_blob_bordered.elempack;
              bottom_blob_int8_g.allocator = bottom_blob_bordered.allocator;
              bottom_blob_int8_g.dims = 2;
              bottom_blob_int8_g.w = bottom_blob_bordered.w;
              bottom_blob_int8_g.h = bottom_blob_bordered.h;
              bottom_blob_int8_g.c = 1;
              bottom_blob_int8_g.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
              bottom_blob_int8_g.data = pvVar30;
              Mat::~Mat(&bottom_blob_int8_g);
              lVar31 = lVar23 + (long)pvVar30;
              pvVar34 = (void *)(lVar23 * 2 + (long)pvVar30);
              for (iVar19 = 0; iVar19 != iVar25; iVar19 = iVar19 + 1) {
                lVar29 = 0;
                lVar36 = lVar35;
                for (iVar37 = iVar20; 0 < iVar37; iVar37 = iVar37 + -1) {
                  *(float *)(lVar35 + lVar29 * 4) =
                       (float)((int)*(char *)(lVar33 + 8 + lVar26) *
                               (int)*(char *)((long)pvVar34 + lVar29 + 2) +
                               (int)*(char *)(lVar33 + 7 + lVar26) *
                               (int)*(char *)((long)pvVar34 + lVar29 + 1) +
                              (int)*(char *)(lVar33 + 6 + lVar26) *
                              (int)*(char *)((long)pvVar34 + lVar29) +
                              (int)*(char *)(lVar33 + 5 + lVar26) *
                              (int)*(char *)(lVar31 + 2 + lVar29) +
                              (int)*(char *)(lVar33 + 4 + lVar26) *
                              (int)*(char *)(lVar31 + 1 + lVar29) +
                              (int)*(char *)(lVar33 + 3 + lVar26) * (int)*(char *)(lVar31 + lVar29)
                              + (int)*(char *)(lVar33 + 2 + lVar26) *
                                (int)*(char *)((long)pvVar30 + lVar29 + 2) +
                              (int)*(char *)(lVar33 + 1 + lVar26) *
                              (int)*(char *)((long)pvVar30 + lVar29 + 1) +
                              (int)*(char *)(lVar33 + lVar26) *
                              (int)*(char *)((long)pvVar30 + lVar29)) * fVar1 +
                       *(float *)(lVar35 + lVar29 * 4);
                  lVar36 = lVar36 + 4;
                  lVar29 = lVar29 + 1;
                }
                pvVar30 = (void *)((long)pvVar30 + lVar29 + 2);
                lVar31 = lVar31 + lVar29 + 2;
                pvVar34 = (void *)((long)pvVar34 + lVar29 + 2);
                lVar35 = lVar36;
              }
              Mat::~Mat(&bottom_blob_g);
            }
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b8);
            pLVar7 = this->activation;
          }
          else {
            if ((((*(int *)(&this->field_0xcc + (long)p_Var28) != 2) ||
                 (*(int *)(&this->field_0xd0 + (long)p_Var28) != 2)) ||
                (*(int *)(&this->field_0xc4 + (long)p_Var28) != 1)) ||
               (*(int *)(&this->field_0xc8 + (long)p_Var28) != 1)) goto LAB_0014abaa;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_d0,&requantize_scales);
            lVar23 = (long)bottom_blob_bordered.w;
            iVar20 = top_blob->w;
            lVar33 = *(long *)(&this->field_0x140 + (long)p_Var28);
            lVar6 = *(long *)(&this->field_0x180 + (long)p_Var28);
            lVar26 = (long)((bottom_blob_bordered.w - iVar20) * 2);
            uVar32 = 0;
            uVar8 = top_blob->h;
            if (top_blob->h < 1) {
              uVar8 = 0;
            }
            uVar9 = top_blob->c;
            if (top_blob->c < 1) {
              uVar9 = 0;
            }
            for (; uVar32 != uVar9; uVar32 = uVar32 + 1) {
              Mat::channel(&bottom_blob_g,top_blob,(int)uVar32);
              if (lVar6 == 0) {
                fVar38 = 0.0;
              }
              else {
                fVar38 = *(float *)(lVar6 + uVar32 * 4);
              }
              pfVar27 = (float *)CONCAT44(bottom_blob_g.data._4_4_,bottom_blob_g.data._0_4_);
              fVar1 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar32];
              Mat::fill(&bottom_blob_g,fVar38);
              lVar35 = uVar32 * 9;
              bottom_blob_int8_g.elemsize =
                   CONCAT44(bottom_blob_bordered.elemsize._4_4_,
                            (undefined4)bottom_blob_bordered.elemsize);
              pvVar30 = (void *)((long)(int)uVar32 * bottom_blob_bordered.cstep *
                                 bottom_blob_int8_g.elemsize + (long)bottom_blob_bordered.data);
              bottom_blob_int8_g.refcount = (int *)0x0;
              bottom_blob_int8_g.elempack = bottom_blob_bordered.elempack;
              bottom_blob_int8_g.allocator = bottom_blob_bordered.allocator;
              bottom_blob_int8_g.dims = 2;
              bottom_blob_int8_g.w = bottom_blob_bordered.w;
              bottom_blob_int8_g.h = bottom_blob_bordered.h;
              bottom_blob_int8_g.c = 1;
              bottom_blob_int8_g.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
              bottom_blob_int8_g.data = pvVar30;
              Mat::~Mat(&bottom_blob_int8_g);
              lVar31 = lVar23 + (long)pvVar30;
              pvVar34 = (void *)(lVar23 * 2 + (long)pvVar30);
              for (uVar24 = 0; uVar24 != uVar8; uVar24 = uVar24 + 1) {
                lVar36 = 0;
                for (iVar25 = iVar20; 0 < iVar25; iVar25 = iVar25 + -1) {
                  *pfVar27 = (float)((int)*(char *)(lVar33 + 8 + lVar35) *
                                     (int)*(char *)((long)pvVar34 + lVar36 + 2) +
                                     (int)*(char *)(lVar33 + 7 + lVar35) *
                                     (int)*(char *)((long)pvVar34 + lVar36 + 1) +
                                    (int)*(char *)(lVar33 + 6 + lVar35) *
                                    (int)*(char *)((long)pvVar34 + lVar36) +
                                    (int)*(char *)(lVar33 + 5 + lVar35) *
                                    (int)*(char *)(lVar31 + 2 + lVar36) +
                                    (int)*(char *)(lVar33 + 4 + lVar35) *
                                    (int)*(char *)(lVar31 + 1 + lVar36) +
                                    (int)*(char *)(lVar33 + 3 + lVar35) *
                                    (int)*(char *)(lVar31 + lVar36) +
                                    (int)*(char *)(lVar33 + 2 + lVar35) *
                                    (int)*(char *)((long)pvVar30 + lVar36 + 2) +
                                    (int)*(char *)(lVar33 + 1 + lVar35) *
                                    (int)*(char *)((long)pvVar30 + lVar36 + 1) +
                                    (int)*(char *)(lVar33 + lVar35) *
                                    (int)*(char *)((long)pvVar30 + lVar36)) * fVar1 + *pfVar27;
                  pfVar27 = pfVar27 + 1;
                  lVar36 = lVar36 + 2;
                }
                pvVar30 = (void *)((long)pvVar30 + lVar36 + lVar26);
                lVar31 = lVar31 + lVar26 + lVar36;
                pvVar34 = (void *)((long)pvVar34 + lVar36 + lVar26);
              }
              Mat::~Mat(&bottom_blob_g);
            }
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d0);
            pLVar7 = this->activation;
          }
          if (pLVar7 != (Layer *)0x0) {
            (*pLVar7->_vptr_Layer[9])(pLVar7,top_blob,opt);
          }
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
        local_240 = 0;
      }
      else {
LAB_0014abbb:
        p_Var28 = this->_vptr_ConvolutionDepthWise_x86[-3];
        iVar19 = iVar19 / *(int *)(&this->field_0xf0 + (long)p_Var28);
        iVar20 = *(int *)(&this->field_0xb8 + (long)p_Var28) /
                 *(int *)(&this->field_0xf0 + (long)p_Var28);
        local_240 = 0;
        iVar25 = 0;
        local_248._0_4_ = 0;
        for (lVar33 = 0; lVar33 < *(int *)(&this->field_0xf0 + (long)p_Var28); lVar33 = lVar33 + 1)
        {
          Mat::channel_range(&bottom_blob_g,&bottom_blob_bordered,iVar25,iVar19);
          Mat::channel_range(&bottom_blob_int8_g,top_blob,(int)local_248,iVar20);
          pLVar7 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar33];
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)opt;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)opt->workspace_allocator;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)top_blob->allocator;
          (*pLVar7->_vptr_Layer[7])(pLVar7,&bottom_blob_g,&bottom_blob_int8_g,&requantize_scales);
          Mat::~Mat(&bottom_blob_int8_g);
          Mat::~Mat(&bottom_blob_g);
          p_Var28 = this->_vptr_ConvolutionDepthWise_x86[-3];
          local_248._0_4_ = (int)local_248 + iVar20;
          iVar25 = iVar25 + iVar19;
        }
      }
    }
  }
  Mat::~Mat(&bottom_blob_bordered);
LAB_0014ad63:
  Mat::~Mat(&bottom_blob_unbordered);
  return local_240;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        bottom_blob_unbordered.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_unbordered.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_unbordered.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_unbordered.channel_range(channels_g * g, channels_g);

            quantize_float32_to_int8(bottom_blob_g, bottom_blob_int8_g, bottom_blob_int8_scales[g], opt_g);
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (use_int8_requantize)
        {
            std::vector<float> requantize_scales;
            for (int g=0; g<group; g++)
            {
                float scale_in;
                if (weight_data_int8_scales[g] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                float scale_out = top_blob_int8_scale;

                requantize_scales.push_back(scale_in);
                requantize_scales.push_back(scale_out);
            }

            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
        else
        {
            std::vector<float> dequantize_scales;
            for (int g=0; g<group; g++)
            {
                float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                dequantize_scales.push_back(top_rescale);
            }

            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1)
            {
                convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2 && dilation_w == 1 && dilation_h == 1)
            {
                convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}